

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

void anon_unknown.dwarf_71875::replace(string *str,string *find,string *replace)

{
  ulong uVar1;
  
  for (uVar1 = std::__cxx11::string::find((char *)str,(ulong)(find->_M_dataplus)._M_p,0);
      uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find
                        ((char *)str,(ulong)(find->_M_dataplus)._M_p,
                         uVar1 + replace->_M_string_length)) {
    std::__cxx11::string::replace
              ((ulong)str,uVar1,(char *)find->_M_string_length,(ulong)(replace->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void replace(
    std::string& str,
    const std::string& find,
    const std::string& replace) {
  std::string::size_type pos = 0u;
  while ((pos = str.find(find, pos)) != std::string::npos) {
    str.replace(pos, find.length(), replace);
    pos += replace.length();
  }
}